

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
 __thiscall kj::anon_unknown_36::HttpInputStreamImpl::readRequestHeaders(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *this_00;
  int *piVar1;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *__return_storage_ptr___00;
  PromiseArenaMember *node;
  long lVar2;
  undefined8 uVar3;
  SourceLocation location;
  bool bVar4;
  bool bVar5;
  coroutine_handle<void> coroutine;
  undefined8 *puVar6;
  StringPtr *header;
  undefined8 *puVar7;
  long in_RSI;
  FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *pFVar8;
  
  coroutine._M_fr_ptr = operator_new(0x588);
  *(code **)coroutine._M_fr_ptr = readRequestHeaders;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readRequestHeaders;
  this_00 = (Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
             *)((long)coroutine._M_fr_ptr + 0x10);
  *(long *)((long)coroutine._M_fr_ptr + 0x578) = in_RSI;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642198;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006421e0;
  location.function = "readRequestHeaders";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x62c;
  location.columnNumber = 0x42;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642198;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006421e0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  piVar1 = (int *)(in_RSI + 0xb0);
  if (*(char *)(in_RSI + 0xa8) != '\0') {
    pFVar8 = (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
              *)((long)coroutine._M_fr_ptr + 0x470);
    if (*piVar1 == 2) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x470) = 2;
      uVar3 = *(undefined8 *)(in_RSI + 0xc0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x478) = *(undefined8 *)(in_RSI + 0xb8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x480) = uVar3;
    }
    else if (*piVar1 == 1) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x470) = 1;
      uVar3 = *(undefined8 *)(in_RSI + 0xc0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x478) = *(undefined8 *)(in_RSI + 0xb8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x480) = uVar3;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x488) = *(undefined8 *)(in_RSI + 200);
    }
    kj::_::
    Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::fulfill(this_00,pFVar8);
    if (pFVar8->tag == 1) {
      pFVar8->tag = 0;
    }
    if (pFVar8->tag == 2) {
      pFVar8->tag = 0;
    }
    if (pFVar8->tag == 3) {
      pFVar8->tag = 0;
    }
    if (*(char *)(in_RSI + 0xa8) == '\x01') {
      *(char *)(in_RSI + 0xa8) = '\0';
      if (*piVar1 == 1) {
        *piVar1 = 0;
      }
      if (*piVar1 == 2) {
        *piVar1 = 0;
      }
    }
    goto LAB_003a74bb;
  }
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x570);
  readMessageHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)coroutine._M_fr_ptr + 0x278);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x580) = 0;
  bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (bVar5) {
    return (PromiseBase)(PromiseBase)this;
  }
  __return_storage_ptr___00 =
       (OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
       ((long)coroutine._M_fr_ptr + 0x4b0);
  kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
  await_resume(__return_storage_ptr___00,__return_storage_ptr__);
  if (*(char *)((long)coroutine._M_fr_ptr + 0x428) == '\x01') {
    if (*(int *)((long)coroutine._M_fr_ptr + 0x430) == 1) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
    }
    if (*(int *)((long)coroutine._M_fr_ptr + 0x430) == 2) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
    }
  }
  if (*(char *)((long)coroutine._M_fr_ptr + 0x290) == '\x01') {
    Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x298));
  }
  kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
  node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
  if (node != (PromiseArenaMember *)0x0) {
    (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  if (__return_storage_ptr___00->tag == 1) {
    pFVar8 = (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
              *)((long)coroutine._M_fr_ptr + 0x530);
    lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x578);
    if (*(long *)(lVar2 + 0x58) != 0) {
      puVar7 = *(undefined8 **)(lVar2 + 0x50);
      puVar6 = puVar7 + *(long *)(lVar2 + 0x58) * 2;
      do {
        *puVar7 = "";
        puVar7[1] = 1;
        puVar7 = puVar7 + 2;
      } while (puVar7 != puVar6);
    }
    *(undefined8 *)(*(long *)((long)coroutine._M_fr_ptr + 0x578) + 0x70) =
         *(undefined8 *)(*(long *)((long)coroutine._M_fr_ptr + 0x578) + 0x68);
    HttpHeaders::tryParseRequestOrConnect
              (pFVar8,(HttpHeaders *)(lVar2 + 0x48),
               *(ArrayPtr<char> *)((long)coroutine._M_fr_ptr + 0x4b8));
    kj::_::
    Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::fulfill(this_00,pFVar8);
LAB_003a7468:
    if (pFVar8->tag == 1) {
      pFVar8->tag = 0;
    }
    if (pFVar8->tag == 2) {
      pFVar8->tag = 0;
    }
    if (pFVar8->tag == 3) {
      pFVar8->tag = 0;
    }
    bVar4 = true;
    bVar5 = false;
  }
  else {
    if (__return_storage_ptr___00->tag == 2) {
      pFVar8 = (FixVoid<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *)((long)coroutine._M_fr_ptr + 0x4f0);
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4f0) = 3;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4f8) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4b8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x500) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x508) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x510) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x518) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d8);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x520) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e0);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x528) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e8);
      kj::_::
      Coroutine<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
      ::fulfill(this_00,pFVar8);
      goto LAB_003a7468;
    }
    bVar5 = true;
    bVar4 = false;
  }
  if (bVar5) {
    kj::_::unreachable();
  }
  if (__return_storage_ptr___00->tag == 1) {
    __return_storage_ptr___00->tag = 0;
  }
  if (__return_storage_ptr___00->tag == 2) {
    __return_storage_ptr___00->tag = 0;
  }
  if (!bVar4) {
    if (*(char *)((long)coroutine._M_fr_ptr + 0x230) == '\x01') {
      if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 1) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
      }
      if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 2) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
      }
      if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 3) {
        *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
      }
    }
    if ((((ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98))->exception).ptr.isSet == true) {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
    }
    kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
    operator_delete(coroutine._M_fr_ptr,0x588);
    return (PromiseBase)(PromiseBase)this;
  }
LAB_003a74bb:
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x580) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

inline kj::Promise<HttpHeaders::RequestConnectOrProtocolError> readRequestHeaders() {
    KJ_IF_SOME(resuming, resumingRequest) {
      KJ_DEFER(resumingRequest = kj::none);
      co_return HttpHeaders::RequestConnectOrProtocolError(resuming);
    }

    auto textOrError = co_await readMessageHeaders();
    KJ_SWITCH_ONEOF(textOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        headers.clear();
        co_return headers.tryParseRequestOrConnect(text);
      }
    }

    KJ_UNREACHABLE;
  }